

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 ImGui::NavCalcPreferredRefPos(void)

{
  ImVec2 *mouse_pos;
  float fVar1;
  ImGuiNavLayer IVar2;
  ImGuiWindow *pIVar3;
  ImGuiViewportP *pIVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  float fVar7;
  ImVec2 IVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  pIVar5 = GImGui;
  if (((GImGui->NavDisableHighlight == false) && (GImGui->NavDisableMouseHover == true)) &&
     (pIVar3 = GImGui->NavWindow, pIVar3 != (ImGuiWindow *)0x0)) {
    IVar2 = GImGui->NavLayer;
    fVar7 = (GImGui->Style).FramePadding.x * 4.0;
    fVar10 = (GImGui->Style).FramePadding.y;
    fVar1 = pIVar3->NavRectRel[IVar2].Min.x;
    fVar11 = pIVar3->NavRectRel[IVar2].Max.x - fVar1;
    if (fVar11 <= fVar7) {
      fVar7 = fVar11;
    }
    fVar11 = pIVar3->NavRectRel[IVar2].Max.y;
    fVar12 = fVar11 - pIVar3->NavRectRel[IVar2].Min.y;
    if (fVar12 <= fVar10) {
      fVar10 = fVar12;
    }
    fVar12 = fVar7 + fVar1 + (pIVar3->Pos).x;
    fVar9 = (fVar11 - fVar10) + (pIVar3->Pos).y;
    pIVar4 = pIVar3->Viewport;
    fVar10 = (pIVar4->super_ImGuiViewport).Pos.x;
    fVar1 = (pIVar4->super_ImGuiViewport).Pos.y;
    fVar7 = (pIVar4->super_ImGuiViewport).Size.x + fVar10;
    fVar11 = (pIVar4->super_ImGuiViewport).Size.y + fVar1;
    if (fVar9 <= fVar11) {
      fVar11 = fVar9;
    }
    if (fVar12 <= fVar7) {
      fVar7 = fVar12;
    }
    IVar8.x = (float)(int)(float)(-(uint)(fVar12 < fVar10) & (uint)fVar10 |
                                 ~-(uint)(fVar12 < fVar10) & (uint)fVar7);
    IVar8.y = (float)(int)(float)(-(uint)(fVar9 < fVar1) & (uint)fVar1 |
                                 ~-(uint)(fVar9 < fVar1) & (uint)fVar11);
  }
  else {
    mouse_pos = &(GImGui->IO).MousePos;
    bVar6 = IsMousePosValid(mouse_pos);
    if (bVar6) {
      IVar8 = *mouse_pos;
    }
    else {
      IVar8 = pIVar5->MouseLastValidPos;
    }
  }
  return IVar8;
}

Assistant:

static ImVec2 ImGui::NavCalcPreferredRefPos()
{
    ImGuiContext& g = *GImGui;
    if (g.NavDisableHighlight || !g.NavDisableMouseHover || !g.NavWindow)
    {
        // Mouse (we need a fallback in case the mouse becomes invalid after being used)
        if (IsMousePosValid(&g.IO.MousePos))
            return g.IO.MousePos;
        return g.MouseLastValidPos;
    }
    else
    {
        // When navigation is active and mouse is disabled, decide on an arbitrary position around the bottom left of the currently navigated item.
        const ImRect& rect_rel = g.NavWindow->NavRectRel[g.NavLayer];
        ImVec2 pos = g.NavWindow->Pos + ImVec2(rect_rel.Min.x + ImMin(g.Style.FramePadding.x * 4, rect_rel.GetWidth()), rect_rel.Max.y - ImMin(g.Style.FramePadding.y, rect_rel.GetHeight()));
        ImGuiViewport* viewport = g.NavWindow->Viewport;
        return ImFloor(ImClamp(pos, viewport->Pos, viewport->Pos + viewport->Size)); // ImFloor() is important because non-integer mouse position application in backend might be lossy and result in undesirable non-zero delta.
    }
}